

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  pointer piVar2;
  bool bVar3;
  internal iVar4;
  int iVar5;
  int i;
  uint index;
  char *in_R9;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  TypeParam ht3;
  hasher hasher;
  TypeParam ht1;
  TypeParam ht2;
  AssertHelper local_230;
  undefined8 *local_228;
  AssertHelper local_220;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_218;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_210;
  allocator_type local_1e8;
  undefined1 local_1d8 [8];
  int *local_1d0;
  char local_1c8 [104];
  pointer local_160;
  Hasher local_14c;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_140;
  undefined1 local_b8 [8];
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  local_1d8 = (undefined1  [8])0x0;
  local_1d0 = (int *)((ulong)local_1d0 & 0xffffffff00000000);
  local_210.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_210.first.super_iterator.pos =
       (pointer)((ulong)local_210.first.super_iterator.pos & 0xffffffff00000000);
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
  local_b0.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_140,0,(hasher *)local_1d8,(key_equal *)&local_210,(allocator_type *)local_b8);
  local_210.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_210.first.super_iterator.pos =
       (pointer)((ulong)local_210.first.super_iterator.pos & 0xffffffff00000000);
  local_1e8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_1e8.count_ = (int *)((ulong)local_1e8.count_._4_4_ << 0x20);
  local_1d8 = (undefined1  [8])((ulong)local_1d8 & 0xffffffff00000000);
  local_1d0 = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_b8,0,(hasher *)&local_210,(key_equal *)&local_1e8,(allocator_type *)local_1d8)
  ;
  this_00 = &local_140.
             super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_210.first.super_iterator.pos = (pointer)0x0;
  local_210.first.super_iterator.ht._0_1_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_210,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
    piVar2 = local_210.first.super_iterator.pos;
    if (local_210.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_210.first.super_iterator.pos != local_210.first.super_iterator.pos + 4)
      {
        operator_delete(*(pointer *)local_210.first.super_iterator.pos);
      }
      operator_delete(piVar2);
    }
  }
  local_210.first.super_iterator.ht._0_1_ =
       google::
       dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::operator==(this_00,&local_b0);
  local_210.first.super_iterator.pos = (pointer)0x0;
  if (!(bool)local_210.first.super_iterator.ht._0_1_) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_210,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
    piVar2 = local_210.first.super_iterator.pos;
    if (local_210.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_210.first.super_iterator.pos != local_210.first.super_iterator.pos + 4)
      {
        operator_delete(*(pointer *)local_210.first.super_iterator.pos);
      }
      operator_delete(piVar2);
    }
  }
  iVar5 = UniqueObjectHelper<int>(1);
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  local_140.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar5;
  local_140.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.use_deleted_ =
       true;
  local_210.first.super_iterator.ht._0_1_ =
       google::
       dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::operator==(this_00,&local_b0);
  local_210.first.super_iterator.pos = (pointer)0x0;
  if (!(bool)local_210.first.super_iterator.ht._0_1_) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_210,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
    piVar2 = local_210.first.super_iterator.pos;
    if (local_210.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_210.first.super_iterator.pos != local_210.first.super_iterator.pos + 4)
      {
        operator_delete(*(pointer *)local_210.first.super_iterator.pos);
      }
      operator_delete(piVar2);
    }
  }
  local_210.first.super_iterator.ht._0_1_ =
       google::
       dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
       ::operator==(this_00,&local_b0);
  local_210.first.super_iterator.pos = (pointer)0x0;
  if (!(bool)local_210.first.super_iterator.ht._0_1_) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_210,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
    piVar2 = local_210.first.super_iterator.pos;
    if (local_210.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_210.first.super_iterator.pos != local_210.first.super_iterator.pos + 4)
      {
        operator_delete(*(pointer *)local_210.first.super_iterator.pos);
      }
      operator_delete(piVar2);
    }
  }
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize(this_00,2000);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_210.first.super_iterator.ht =
       (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT71(local_210.first.super_iterator.ht._1_7_,bVar3);
  local_210.first.super_iterator.pos = (pointer)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)&local_210,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_1d8);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
    piVar2 = local_210.first.super_iterator.pos;
    if (local_210.first.super_iterator.pos != (pointer)0x0) {
      if (*(pointer *)local_210.first.super_iterator.pos != local_210.first.super_iterator.pos + 4)
      {
        operator_delete(*(pointer *)local_210.first.super_iterator.pos);
      }
      operator_delete(piVar2);
    }
  }
  local_14c.id_ = 1;
  local_14c.num_hashes_ = 0;
  local_14c.num_compares_ = 0;
  local_1e8.id_ = 2;
  local_1e8.count_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_1d8,5,(hasher *)&local_14c,(key_equal *)&local_14c,&local_1e8);
  iVar4 = (internal)
          google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,(dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)&local_1d0);
  local_228 = (undefined8 *)0x0;
  local_230.data_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_210,(internal *)&local_230,(AssertionResult *)"ht1 == ht3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,(char *)local_210.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_210.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_210.first.super_iterator + 0x10U)) {
      operator_delete(local_210.first.super_iterator.ht);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
    puVar1 = local_228;
    if (local_228 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_228 != local_228 + 2) {
        operator_delete((undefined8 *)*local_228);
      }
      operator_delete(puVar1);
    }
  }
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,(dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)&local_1d0);
  local_230.data_._0_4_ = CONCAT31(local_230.data_._1_3_,bVar3);
  local_228 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_210,(internal *)&local_230,(AssertionResult *)"ht1 != ht3","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,(char *)local_210.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_210.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_210.first.super_iterator + 0x10U)) {
      operator_delete(local_210.first.super_iterator.ht);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
    puVar1 = local_228;
    if (local_228 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_228 != local_228 + 2) {
        operator_delete((undefined8 *)*local_228);
      }
      operator_delete(puVar1);
    }
  }
  local_230.data_._0_4_ = UniqueObjectHelper<int>(2);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_210,
           &local_140.
            super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)&local_230);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_228 = (undefined8 *)0x0;
  local_230.data_._0_1_ = (internal)!bVar3;
  if (bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_210,(internal *)&local_230,(AssertionResult *)"ht1 != ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,(char *)local_210.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_210.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_210.first.super_iterator + 0x10U)) {
      operator_delete(local_210.first.super_iterator.ht);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
    puVar1 = local_228;
    if (local_228 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_228 != local_228 + 2) {
        operator_delete((undefined8 *)*local_228);
      }
      operator_delete(puVar1);
    }
  }
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_230.data_._0_4_ = CONCAT31(local_230.data_._1_3_,!bVar3);
  local_228 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_210,(internal *)&local_230,(AssertionResult *)"ht1 == ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,(char *)local_210.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_210.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_210.first.super_iterator + 0x10U)) {
      operator_delete(local_210.first.super_iterator.ht);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
    puVar1 = local_228;
    if (local_228 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_228 != local_228 + 2) {
        operator_delete((undefined8 *)*local_228);
      }
      operator_delete(puVar1);
    }
  }
  local_230.data_._0_4_ = UniqueObjectHelper<int>(2);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(&local_210,
           (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_b8,(value_type *)&local_230);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_230.data_._0_4_ = CONCAT31(local_230.data_._1_3_,bVar3);
  local_228 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_210,(internal *)&local_230,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,(char *)local_210.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_210.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_210.first.super_iterator + 0x10U)) {
      operator_delete(local_210.first.super_iterator.ht);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
    puVar1 = local_228;
    if (local_228 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_228 != local_228 + 2) {
        operator_delete((undefined8 *)*local_228);
      }
      operator_delete(puVar1);
    }
  }
  iVar5 = 3;
  do {
    local_230.data_._0_4_ = UniqueObjectHelper<int>(iVar5);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_210,
             &local_140.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)&local_230);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x7d1);
  index = 0x7d1;
  do {
    index = index - 1;
    local_230.data_._0_4_ = UniqueObjectHelper<int>(index);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_210,
             (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_b8,(value_type *)&local_230);
  } while (3 < index);
  bVar3 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(this_00,&local_b0);
  local_230.data_._0_4_ = CONCAT31(local_230.data_._1_3_,bVar3);
  local_228 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_210,(internal *)&local_230,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,(char *)local_210.first.super_iterator.ht);
    testing::internal::AssertHelper::operator=(&local_220,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    if (local_210.first.super_iterator.ht !=
        (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)((long)&local_210.first.super_iterator + 0x10U)) {
      operator_delete(local_210.first.super_iterator.ht);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
    puVar1 = local_228;
    if (local_228 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_228 != local_228 + 2) {
        operator_delete((undefined8 *)*local_228);
      }
      operator_delete(puVar1);
    }
  }
  local_1d8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c175a8;
  if (local_160 != (pointer)0x0) {
    free(local_160);
  }
  local_b8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c175a8;
  if (local_b0.table != (pointer)0x0) {
    free(local_b0.table);
  }
  local_140.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c175a8;
  if (local_140.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_140.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}